

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

String * __thiscall
Json::valueToString_abi_cxx11_(String *__return_storage_ptr__,Json *this,bool value)

{
  char *__s;
  allocator<char> local_9;
  
  __s = "false";
  if ((int)this != 0) {
    __s = "true";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

String valueToString(bool value) { return value ? "true" : "false"; }